

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_12e14a::CreateJump(VmModule *module,SynBase *source,VmValue *label)

{
  VmInstruction *pVVar1;
  VmValue *in_stack_fffffffffffffff8;
  
  if (((label->type).type == VM_TYPE_BLOCK) && ((label->type).size == 4)) {
    pVVar1 = CreateInstruction((anon_unknown_dwarf_12e14a *)module,(VmModule *)source,(SynBase *)0x0
                               ,(VmType)(ZEXT816(0x1c) << 0x40),(VmInstructionType)label,
                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                               in_stack_fffffffffffffff8);
    return &pVVar1->super_VmValue;
  }
  __assert_fail("label->type == VmType::Block",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x2c9,
                "VmValue *(anonymous namespace)::CreateJump(VmModule *, SynBase *, VmValue *)");
}

Assistant:

VmValue* CreateJump(VmModule *module, SynBase *source, VmValue *label)
	{
		assert(label->type == VmType::Block);

		return CreateInstruction(module, source, VmType::Void, VM_INST_JUMP, label);
	}